

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegdec.c
# Opt level: O2

int ReadJPEG(uint8_t *data,size_t data_size,WebPPicture *pic,int keep_alpha,Metadata *metadata)

{
  byte bVar1;
  void *pvVar2;
  void *__s2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  uint8_t *puVar7;
  uint uVar8;
  long *plVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  char *__format;
  size_t __size;
  uint uVar13;
  uint uVar14;
  uint64_t stride;
  long lVar15;
  long lVar16;
  size_t sVar17;
  int ok;
  uint8_t *rgb;
  uint8_t *local_1c70;
  undefined8 local_1c68;
  undefined8 uStack_1c60;
  code *local_1c58;
  code *pcStack_1c50;
  code *local_1c48;
  code *pcStack_1c40;
  code *local_1c38;
  uint8_t *local_1c30;
  size_t local_1c28;
  undefined8 local_1c18;
  undefined1 local_1c10 [32];
  undefined8 *local_1bf0;
  undefined4 local_1bd8;
  undefined4 local_1bb4;
  uint local_1b90;
  uint local_1b8c;
  int local_1b84;
  uint local_1b70;
  long local_1a88 [32];
  my_error_mgr jerr;
  unsigned_long local_1818;
  size_t sStack_1810;
  undefined4 auStack_1808 [1526];
  
  ok = 0;
  rgb = (uint8_t *)0x0;
  if (pic == (WebPPicture *)0x0 || (data_size == 0 || data == (uint8_t *)0x0)) {
    return 0;
  }
  local_1c48 = (code *)0x0;
  pcStack_1c40 = (code *)0x0;
  local_1c58 = (code *)0x0;
  pcStack_1c50 = (code *)0x0;
  local_1c38 = (code *)0x0;
  local_1c68 = 0;
  uStack_1c60 = 0;
  local_1c30 = data;
  local_1c28 = data_size;
  memset(local_1c10,0,0x288);
  local_1c18 = jpeg_std_error(&jerr);
  jerr.pub.error_exit = my_error_exit;
  iVar5 = _setjmp((__jmp_buf_tag *)jerr.setjmp_buffer);
  if (iVar5 == 0) {
    jpeg_CreateDecompress(&local_1c18,0x50,0x290);
    local_1bf0 = &local_1c68;
    local_1c58 = ContextInit;
    pcStack_1c50 = ContextFill;
    local_1c48 = ContextSkip;
    pcStack_1c40 = jpeg_resync_to_restart;
    local_1c38 = ContextTerm;
    local_1c68 = 0;
    uStack_1c60 = 0;
    if (metadata != (Metadata *)0x0) {
      jpeg_save_markers(&local_1c18,0xe1,0xffff);
      jpeg_save_markers(&local_1c18,0xe2,0xffff);
    }
    jpeg_read_header(&local_1c18,1);
    local_1bd8 = 2;
    local_1bb4 = 1;
    jpeg_start_decompress(&local_1c18);
    uVar3 = local_1b8c;
    if (local_1b84 == 3) {
      stride = (ulong)local_1b90 * 3;
      if ((long)(int)stride == stride) {
        sVar17 = (size_t)(int)local_1b8c;
        iVar5 = ImgIoUtilCheckSizeArgumentsOverflow(stride,sVar17);
        if ((iVar5 != 0) && (rgb = (uint8_t *)malloc(sVar17 * stride), rgb != (uint8_t *)0x0)) {
          local_1c70 = rgb;
          while (local_1b70 < local_1b8c) {
            iVar5 = jpeg_read_scanlines(&local_1c18,&local_1c70,1);
            if (iVar5 != 1) goto LAB_00105ae8;
            local_1c70 = local_1c70 + stride;
          }
          if (metadata != (Metadata *)0x0) {
            memset(&local_1818,0,0x17e8);
            plVar9 = local_1a88;
            __size = 0;
            uVar14 = 0;
            uVar8 = 0;
            uVar11 = 0;
            while (plVar9 = (long *)*plVar9, plVar9 != (long *)0x0) {
              if ((*(char *)(plVar9 + 1) == -0x1e) &&
                 (uVar13 = *(uint *)(plVar9 + 2), 0xe < (ulong)uVar13)) {
                pvVar2 = (void *)plVar9[3];
                iVar5 = bcmp(pvVar2,"ICC_PROFILE",0xc);
                if (iVar5 == 0) {
                  bVar1 = *(byte *)((long)pvVar2 + 0xc);
                  uVar6 = (ulong)uVar13 - 0xe;
                  if ((*(byte *)((long)pvVar2 + 0xd) == 0) || (bVar1 == 0)) {
                    fprintf(_stderr,
                            "[ICCP] size (%d) / count (%d) / sequence number (%d) cannot be 0!\n",
                            uVar6 & 0xffffffff);
                    goto LAB_00105a96;
                  }
                  uVar13 = (uint)*(byte *)((long)pvVar2 + 0xd);
                  uVar10 = uVar13;
                  if ((uVar8 != 0) && (uVar10 = uVar8, uVar8 != uVar13)) {
                    __format = "[ICCP] Inconsistent segment count (%d / %d)!\n";
                    uVar11 = uVar8;
                    goto LAB_00105a8f;
                  }
                  uVar12 = (ulong)(uint)bVar1;
                  if (jerr.setjmp_buffer[0].__saved_mask.__val[uVar12 * 3 + 0xe] != 0) {
                    fprintf(_stderr,"[ICCP] Duplicate segment number (%d)!\n",(ulong)(uint)bVar1);
                    goto LAB_00105a96;
                  }
                  jerr.setjmp_buffer[0].__saved_mask.__val[uVar12 * 3 + 0xd] = (long)pvVar2 + 0xe;
                  jerr.setjmp_buffer[0].__saved_mask.__val[uVar12 * 3 + 0xe] = uVar6;
                  __size = __size + uVar6;
                  uVar8 = (uint)bVar1;
                  uVar13 = uVar8;
                  if (uVar8 < uVar11) {
                    uVar13 = uVar11;
                  }
                  *(uint *)(jerr.setjmp_buffer[0].__saved_mask.__val + uVar12 * 3 + 0xf) = uVar8;
                  uVar14 = uVar14 + 1;
                  uVar8 = uVar10;
                  uVar11 = uVar13;
                }
              }
            }
            if (uVar14 == 0) {
LAB_00105987:
              plVar9 = local_1a88;
              while (plVar9 = (long *)*plVar9, plVar9 != (long *)0x0) {
                for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 0x20) {
                  if (*(uint *)((long)&ExtractMetadataFromJPEG_kJPEGMetadataMap + lVar16) ==
                      (uint)*(byte *)(plVar9 + 1)) {
                    uVar6 = *(ulong *)((long)&DAT_0015ec00 + lVar16);
                    sVar17 = *(uint *)(plVar9 + 2) - uVar6;
                    if (uVar6 <= *(uint *)(plVar9 + 2) && sVar17 != 0) {
                      pvVar2 = (void *)plVar9[3];
                      __s2 = *(void **)((long)&PTR_anon_var_dwarf_1e3a_0015ebf8 + lVar16);
                      iVar5 = bcmp(pvVar2,__s2,uVar6);
                      if (iVar5 == 0) {
                        if (*(long *)((long)&(metadata->exif).bytes +
                                     *(long *)((long)&DAT_0015ec08 + lVar16)) == 0) {
                          iVar5 = MetadataCopy((char *)((long)pvVar2 + uVar6),sVar17,
                                               (MetadataPayload *)
                                               ((long)&(metadata->exif).bytes +
                                               *(long *)((long)&DAT_0015ec08 + lVar16)));
                          if (iVar5 == 0) goto LAB_00105a96;
                        }
                        else {
                          fprintf(_stderr,"Ignoring additional \'%s\' marker\n",__s2);
                        }
                      }
                    }
                  }
                }
              }
              bVar4 = true;
            }
            else {
              if (uVar11 == uVar14) {
                if (uVar8 == uVar11) {
                  qsort(&local_1818,(ulong)uVar11,0x18,CompareICCPSegments);
                  puVar7 = (uint8_t *)malloc(__size);
                  (metadata->iccp).bytes = puVar7;
                  if (puVar7 != (uint8_t *)0x0) {
                    (metadata->iccp).size = __size;
                    lVar15 = 0;
                    for (lVar16 = lVar15; (ulong)uVar11 * 0x18 - lVar16 != 0; lVar16 = lVar16 + 0x18
                        ) {
                      memcpy((metadata->iccp).bytes + lVar15,*(void **)((long)&local_1818 + lVar16),
                             *(size_t *)((long)auStack_1808 + lVar16 + -8));
                      lVar15 = lVar15 + *(long *)((long)auStack_1808 + lVar16 + -8);
                    }
                    goto LAB_00105987;
                  }
                }
                else {
                  __format = "[ICCP] Segment count: %d does not match expected: %d!\n";
                  uVar13 = uVar8;
LAB_00105a8f:
                  fprintf(_stderr,__format,(ulong)uVar11,(ulong)uVar13);
                }
              }
              else {
                fprintf(_stderr,"[ICCP] Discontinuous segments, expected: %d actual: %d!\n");
              }
LAB_00105a96:
              bVar4 = false;
            }
            if (!bVar4) {
              fwrite("Error extracting JPEG metadata!\n",0x20,1,_stderr);
              ok = 0;
              goto LAB_00105ae8;
            }
          }
          jpeg_finish_decompress(&local_1c18);
          jpeg_destroy_decompress(&local_1c18);
          pic->width = local_1b90;
          pic->height = uVar3;
          ok = WebPPictureImportRGB(pic,rgb,(int)stride);
          if (ok != 0) goto LAB_00105afd;
        }
      }
    }
  }
LAB_00105ae8:
  MetadataFree(metadata);
  jpeg_destroy_decompress(&local_1c18);
LAB_00105afd:
  free(rgb);
  return ok;
}

Assistant:

int ReadJPEG(const uint8_t* const data, size_t data_size,
             WebPPicture* const pic, int keep_alpha,
             Metadata* const metadata) {
  volatile int ok = 0;
  int width, height;
  int64_t stride;
  volatile struct jpeg_decompress_struct dinfo;
  struct my_error_mgr jerr;
  uint8_t* volatile rgb = NULL;
  JSAMPROW buffer[1];
  JPEGReadContext ctx;

  if (data == NULL || data_size == 0 || pic == NULL) return 0;

  (void)keep_alpha;
  memset(&ctx, 0, sizeof(ctx));
  ctx.data = data;
  ctx.data_size = data_size;

  memset((j_decompress_ptr)&dinfo, 0, sizeof(dinfo));   // for setjmp safety
  dinfo.err = jpeg_std_error(&jerr.pub);
  jerr.pub.error_exit = my_error_exit;

  if (setjmp(jerr.setjmp_buffer)) {
 Error:
    MetadataFree(metadata);
    jpeg_destroy_decompress((j_decompress_ptr)&dinfo);
    goto End;
  }

  jpeg_create_decompress((j_decompress_ptr)&dinfo);
  ContextSetup(&dinfo, &ctx);
  if (metadata != NULL) SaveMetadataMarkers((j_decompress_ptr)&dinfo);
  jpeg_read_header((j_decompress_ptr)&dinfo, TRUE);

  dinfo.out_color_space = JCS_RGB;
  dinfo.do_fancy_upsampling = TRUE;

  jpeg_start_decompress((j_decompress_ptr)&dinfo);

  if (dinfo.output_components != 3) {
    goto Error;
  }

  width = dinfo.output_width;
  height = dinfo.output_height;
  stride = (int64_t)dinfo.output_width * dinfo.output_components * sizeof(*rgb);

  if (stride != (int)stride ||
      !ImgIoUtilCheckSizeArgumentsOverflow(stride, height)) {
    goto Error;
  }

  rgb = (uint8_t*)malloc((size_t)stride * height);
  if (rgb == NULL) {
    goto Error;
  }
  buffer[0] = (JSAMPLE*)rgb;

  while (dinfo.output_scanline < dinfo.output_height) {
    if (jpeg_read_scanlines((j_decompress_ptr)&dinfo, buffer, 1) != 1) {
      goto Error;
    }
    buffer[0] += stride;
  }

  if (metadata != NULL) {
    ok = ExtractMetadataFromJPEG((j_decompress_ptr)&dinfo, metadata);
    if (!ok) {
      fprintf(stderr, "Error extracting JPEG metadata!\n");
      goto Error;
    }
  }

  jpeg_finish_decompress((j_decompress_ptr)&dinfo);
  jpeg_destroy_decompress((j_decompress_ptr)&dinfo);

  // WebP conversion.
  pic->width = width;
  pic->height = height;
  ok = WebPPictureImportRGB(pic, rgb, (int)stride);
  if (!ok) goto Error;

 End:
  free(rgb);
  return ok;
}